

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

Rgba * __thiscall ImagePalette::registerColor(ImagePalette *this,Rgba *rgba)

{
  Rgba RVar1;
  Rgba RVar2;
  uint16_t uVar3;
  Rgba *this_00;
  
  uVar3 = Rgba::cgbColor(rgba);
  this_00 = (Rgba *)((this->_colors)._M_elems + uVar3);
  uVar3 = Rgba::cgbColor(rgba);
  if (uVar3 == 0x8000) {
    options.hasTransparentPixels = true;
  }
  if (this_00[1].red == '\0') {
    *this_00 = *rgba;
    this_00[1].red = '\x01';
  }
  else {
    RVar1 = *this_00;
    RVar2 = *rgba;
    if (((uint)RVar1 >> 0x18 | ((uint)RVar1 & 0xff0000) >> 8 | ((uint)RVar1 & 0xff00) << 8 |
        (int)RVar1 << 0x18) !=
        ((uint)RVar2 >> 0x18 | ((uint)RVar2 & 0xff0000) >> 8 | ((uint)RVar2 & 0xff00) << 8 |
        (int)RVar2 << 0x18)) {
      uVar3 = Rgba::cgbColor(this_00);
      if (uVar3 != 0xffff) {
        return this_00;
      }
      __assert_fail("slot->cgbColor() != UINT16_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                    ,0x38,"registerColor");
    }
  }
  return (Rgba *)0x0;
}

Assistant:

[[nodiscard]] Rgba const *registerColor(Rgba const &rgba) {
		decltype(_colors)::value_type &slot = _colors[rgba.cgbColor()];

		if (rgba.cgbColor() == Rgba::transparent) {
			options.hasTransparentPixels = true;
		}

		if (!slot.has_value()) {
			slot.emplace(rgba);
		} else if (*slot != rgba) {
			assert(slot->cgbColor() != UINT16_MAX);
			return &*slot;
		}
		return nullptr;
	}